

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_reader.hpp
# Opt level: O2

ReaderInitializeType __thiscall
duckdb::MultiFileReader::InitializeReader
          (MultiFileReader *this,MultiFileReaderData *reader_data,MultiFileBindData *bind_data,
          vector<duckdb::MultiFileColumnDefinition,_true> *global_columns,
          vector<duckdb::ColumnIndex,_true> *global_column_ids,
          optional_ptr<duckdb::TableFilterSet,_true> table_filters,ClientContext *context,
          optional_ptr<duckdb::MultiFileReaderGlobalState,_true> global_state)

{
  ReaderInitializeType RVar1;
  MultiFileList *pMVar2;
  OpenFileInfo local_60;
  
  (*this->_vptr_MultiFileReader[10])
            (this,reader_data,&bind_data->file_options,&bind_data->reader_bind,global_columns,
             global_column_ids,context,global_state.ptr);
  pMVar2 = shared_ptr<duckdb::MultiFileList,_true>::operator->(&bind_data->file_list);
  (*pMVar2->_vptr_MultiFileList[8])(&local_60,pMVar2,0);
  RVar1 = (*this->_vptr_MultiFileReader[0xb])
                    (this,context,reader_data,global_columns,global_column_ids,table_filters.ptr,
                     &local_60,&bind_data->reader_bind,&bind_data->virtual_columns);
  OpenFileInfo::~OpenFileInfo(&local_60);
  return RVar1;
}

Assistant:

virtual ReaderInitializeType InitializeReader(MultiFileReaderData &reader_data, const MultiFileBindData &bind_data,
	                                              const vector<MultiFileColumnDefinition> &global_columns,
	                                              const vector<ColumnIndex> &global_column_ids,
	                                              optional_ptr<TableFilterSet> table_filters, ClientContext &context,
	                                              optional_ptr<MultiFileReaderGlobalState> global_state) {
		FinalizeBind(reader_data, bind_data.file_options, bind_data.reader_bind, global_columns, global_column_ids,
		             context, global_state);
		return CreateMapping(context, reader_data, global_columns, global_column_ids, table_filters,
		                     bind_data.file_list->GetFirstFile(), bind_data.reader_bind, bind_data.virtual_columns);
	}